

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmmp.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  long lVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_12;
  ostringstream error_message_11;
  double log_probability;
  Buffer buffer;
  vector<double,_std::allocator<double>_> input_vector;
  int length;
  istream *input_stream;
  ostringstream error_message_10;
  ifstream ifs;
  ostringstream error_message_9;
  ostringstream error_message_8;
  vector<double,_std::allocator<double>_> variance;
  ostringstream error_message_7;
  ostringstream error_message_6;
  int k;
  istream *input_stream_1;
  ostringstream error_message_5;
  ifstream ifs_1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  vector<double,_std::allocator<double>_> weights;
  bool is_diagonal;
  ostringstream error_message_4;
  ostringstream error_message_3;
  int num_input_files;
  char *input_file;
  char *gmm_file;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool full_covariance_flag;
  int num_mixture;
  int num_order;
  option *in_stack_ffffffffffffe318;
  vector<double,_std::allocator<double>_> *data_to_write;
  Buffer *in_stack_ffffffffffffe320;
  string *in_stack_ffffffffffffe328;
  allocator_type *in_stack_ffffffffffffe330;
  SymmetricMatrix *in_stack_ffffffffffffe338;
  SymmetricMatrix *in_stack_ffffffffffffe340;
  undefined7 in_stack_ffffffffffffe350;
  undefined1 in_stack_ffffffffffffe357;
  istream *in_stack_ffffffffffffe358;
  allocator *paVar6;
  undefined6 in_stack_ffffffffffffe360;
  undefined1 in_stack_ffffffffffffe366;
  undefined1 in_stack_ffffffffffffe367;
  undefined8 in_stack_ffffffffffffe368;
  undefined8 in_stack_ffffffffffffe370;
  undefined1 *puVar7;
  char *local_1c88;
  undefined7 in_stack_ffffffffffffe380;
  undefined1 in_stack_ffffffffffffe387;
  istream *in_stack_ffffffffffffe3b0;
  undefined7 in_stack_ffffffffffffe3b8;
  undefined1 in_stack_ffffffffffffe3bf;
  bool local_1b7a;
  bool local_1b4a;
  bool local_1b22;
  allocator *in_stack_ffffffffffffe4e8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe4f0;
  undefined1 in_stack_ffffffffffffe4fa;
  undefined1 in_stack_ffffffffffffe4fb;
  int in_stack_ffffffffffffe4fc;
  int in_stack_ffffffffffffe500;
  ostringstream *in_stack_ffffffffffffe508;
  string *in_stack_ffffffffffffe510;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_ffffffffffffe518;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe520;
  double *in_stack_ffffffffffffe528;
  Buffer *in_stack_ffffffffffffe530;
  allocator local_1961;
  string local_1960 [32];
  ostringstream local_1940 [376];
  allocator_type local_17c8 [103];
  undefined1 local_1761 [29];
  int local_1744;
  char *local_1740;
  allocator local_1731;
  string local_1730 [32];
  ostringstream local_1710 [376];
  char local_1598 [527];
  allocator local_1389;
  string local_1388 [32];
  ostringstream local_1368 [383];
  allocator local_11e9;
  string local_11e8 [32];
  ostringstream local_11c8 [407];
  allocator local_1031;
  string local_1030 [32];
  ostringstream local_1010 [383];
  allocator local_e91;
  string local_e90 [32];
  ostringstream local_e70 [380];
  int local_cf4;
  char *local_cf0;
  int local_ce8;
  allocator local_ce1;
  string local_ce0 [32];
  ostringstream local_cc0 [376];
  char local_b48 [528];
  Buffer local_938;
  byte local_8da;
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [383];
  allocator local_739;
  string local_738 [32];
  ostringstream local_718 [380];
  int local_59c;
  char *local_598;
  char *local_590;
  allocator local_581;
  string local_580 [32];
  ostringstream local_560 [383];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [32];
  int local_20;
  byte local_19;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 0x10;
  local_19 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffe330 >> 0x20),
                                   (char **)in_stack_ffffffffffffe328,
                                   (char *)in_stack_ffffffffffffe320,in_stack_ffffffffffffe318,
                                   (int *)0x103862), pcVar1 = ya_optarg, local_20 != -1) {
    in_stack_ffffffffffffe4f0 = (vector<double,_std::allocator<double>_> *)(ulong)(local_20 - 0x66);
    switch(in_stack_ffffffffffffe4f0) {
    case (vector<double,_std::allocator<double>_> *)0x0:
      local_19 = 1;
      break;
    default:
      anon_unknown.dwarf_2f09::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
      return 1;
    case (vector<double,_std::allocator<double>_> *)0x2:
      anon_unknown.dwarf_2f09::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
      return 0;
    case (vector<double,_std::allocator<double>_> *)0x5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,pcVar1,&local_3e1);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe328,(int *)in_stack_ffffffffffffe320);
      local_1b7a = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      if (local_1b7a) {
        std::__cxx11::ostringstream::ostringstream(local_560);
        std::operator<<((ostream *)local_560,
                        "The argument for the -k option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,"gmmp",&local_581);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_560);
        return local_4;
      }
      break;
    case (vector<double,_std::allocator<double>_> *)0x6:
      in_stack_ffffffffffffe4e8 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,in_stack_ffffffffffffe4e8);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe328,(int *)in_stack_ffffffffffffe320);
      local_1b22 = !bVar2 || local_14 < 1;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_1b22) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        std::operator<<((ostream *)local_1d0,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"gmmp",&local_1f1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
      local_14 = local_14 + -1;
      break;
    case (vector<double,_std::allocator<double>_> *)0x7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar1,&local_219);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe328,(int *)in_stack_ffffffffffffe320);
      local_1b4a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_1b4a) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        poVar4 = std::operator<<((ostream *)local_398,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"gmmp",&local_3b9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
    }
  }
  local_59c = local_8 - ya_optind;
  if (local_59c == 2) {
    local_590 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_598 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_59c != 1) {
      std::__cxx11::ostringstream::ostringstream(local_718);
      std::operator<<((ostream *)local_718,"Just two input files, gmmfile and infile, are required")
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_738,"gmmp",&local_739);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
      std::__cxx11::string::~string(local_738);
      std::allocator<char>::~allocator((allocator<char> *)&local_739);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_718);
      return local_4;
    }
    local_590 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_598 = (char *)0x0;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8b8);
    std::operator<<((ostream *)local_8b8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"gmmp",&local_8d9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b8);
    return local_4;
  }
  local_8da = ~local_19 & 1;
  std::allocator<double>::allocator((allocator<double> *)0x1042c7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe340,
             (size_type)in_stack_ffffffffffffe338,(allocator_type *)in_stack_ffffffffffffe330);
  std::allocator<double>::~allocator((allocator<double> *)0x1042f3);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x104318);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_ffffffffffffe340,(size_type)in_stack_ffffffffffffe338,
           (allocator_type *)in_stack_ffffffffffffe330);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x104344);
  std::allocator<sptk::SymmetricMatrix>::allocator((allocator<sptk::SymmetricMatrix> *)0x104369);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_ffffffffffffe340,(size_type)in_stack_ffffffffffffe338,
             in_stack_ffffffffffffe330);
  std::allocator<sptk::SymmetricMatrix>::~allocator((allocator<sptk::SymmetricMatrix> *)0x104395);
  std::ifstream::ifstream(local_b48);
  pcVar1 = local_590;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_b48,(_Ios_Openmode)pcVar1);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) == 0) {
    local_cf0 = local_b48;
    for (local_cf4 = 0; local_cf4 < local_18; local_cf4 = local_cf4 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)
                 &local_938.precisions_.
                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>.
                  _M_impl.super__Vector_impl_data._M_finish,(long)local_cf4);
      bVar2 = sptk::ReadStream<double>
                        ((double *)in_stack_ffffffffffffe328,(istream *)in_stack_ffffffffffffe320);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_e70);
        std::operator<<((ostream *)local_e70,"Failed to load mixture weight");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e90,"gmmp",&local_e91);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
        std::__cxx11::string::~string(local_e90);
        std::allocator<char>::~allocator((allocator<char> *)&local_e91);
        local_4 = 1;
        local_ce8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e70);
        goto LAB_00104cb8;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&local_938.gconsts_,(long)local_cf4);
      bVar2 = sptk::ReadStream<double>
                        (SUB81((ulong)in_stack_ffffffffffffe370 >> 0x30,0),
                         (int)in_stack_ffffffffffffe370,
                         (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),
                         (int)in_stack_ffffffffffffe368,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffe367,
                                  CONCAT16(in_stack_ffffffffffffe366,in_stack_ffffffffffffe360)),
                         in_stack_ffffffffffffe358,
                         (int *)CONCAT17(in_stack_ffffffffffffe387,in_stack_ffffffffffffe380));
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1010);
        std::operator<<((ostream *)local_1010,"Failed to load mean vector");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1030,"gmmp",&local_1031);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
        std::__cxx11::string::~string(local_1030);
        std::allocator<char>::~allocator((allocator<char> *)&local_1031);
        local_4 = 1;
        local_ce8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1010);
        goto LAB_00104cb8;
      }
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)&local_938
                 ,(long)local_cf4);
      sptk::SymmetricMatrix::Resize
                (in_stack_ffffffffffffe340,(int)((ulong)in_stack_ffffffffffffe338 >> 0x20));
      if ((local_8da & 1) == 0) {
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                  ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                   &local_938,(long)local_cf4);
        in_stack_ffffffffffffe3bf =
             sptk::ReadStream((SymmetricMatrix *)
                              CONCAT17(in_stack_ffffffffffffe3bf,in_stack_ffffffffffffe3b8),
                              in_stack_ffffffffffffe3b0);
        if (!(bool)in_stack_ffffffffffffe3bf) {
          std::__cxx11::ostringstream::ostringstream(local_1368);
          std::operator<<((ostream *)local_1368,"Failed to load covariance matrix");
          paVar6 = &local_1389;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1388,"gmmp",paVar6);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
          std::__cxx11::string::~string(local_1388);
          std::allocator<char>::~allocator((allocator<char> *)&local_1389);
          local_4 = 1;
          local_ce8 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1368);
          goto LAB_00104cb8;
        }
      }
      else {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x104955);
        bVar2 = sptk::ReadStream<double>
                          (SUB81((ulong)in_stack_ffffffffffffe370 >> 0x30,0),
                           (int)in_stack_ffffffffffffe370,
                           (int)((ulong)in_stack_ffffffffffffe368 >> 0x20),
                           (int)in_stack_ffffffffffffe368,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_ffffffffffffe367,
                                    CONCAT16(in_stack_ffffffffffffe366,in_stack_ffffffffffffe360)),
                           in_stack_ffffffffffffe358,
                           (int *)CONCAT17(in_stack_ffffffffffffe387,in_stack_ffffffffffffe380));
        if (bVar2) {
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                    ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                     &local_938,(long)local_cf4);
          sptk::SymmetricMatrix::SetDiagonal
                    (in_stack_ffffffffffffe338,
                     (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe330);
          local_ce8 = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_11c8);
          std::operator<<((ostream *)local_11c8,"Failed to load diagonal covariance vector");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_11e8,"gmmp",&local_11e9);
          sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
          std::__cxx11::string::~string(local_11e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
          local_4 = 1;
          local_ce8 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_11c8);
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe330);
        if (local_ce8 != 0) goto LAB_00104cb8;
      }
    }
    local_ce8 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_cc0);
    poVar4 = std::operator<<((ostream *)local_cc0,"Cannot open file ");
    std::operator<<(poVar4,local_590);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ce0,"gmmp",&local_ce1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
    std::__cxx11::string::~string(local_ce0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
    local_4 = 1;
    local_ce8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_cc0);
  }
LAB_00104cb8:
  std::ifstream::~ifstream(local_b48);
  if (local_ce8 != 0) goto LAB_00105354;
  std::ifstream::ifstream(local_1598);
  pcVar1 = local_598;
  if (local_598 == (char *)0x0) {
LAB_00104eca:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      local_1c88 = (char *)&std::cin;
    }
    else {
      local_1c88 = local_1598;
    }
    local_1740 = local_1c88;
    local_1744 = local_14 + 1;
    lVar5 = (long)local_1744;
    puVar7 = local_1761;
    std::allocator<double>::allocator((allocator<double> *)0x104f40);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe340,
               (size_type)in_stack_ffffffffffffe338,(allocator_type *)in_stack_ffffffffffffe330);
    std::allocator<double>::~allocator((allocator<double> *)0x104f66);
    sptk::GaussianMixtureModeling::Buffer::Buffer(in_stack_ffffffffffffe320);
    do {
      in_stack_ffffffffffffe367 =
           sptk::ReadStream<double>
                     (SUB81((ulong)puVar7 >> 0x30,0),(int)puVar7,(int)((ulong)lVar5 >> 0x20),
                      (int)lVar5,
                      (vector<double,_std::allocator<double>_> *)
                      CONCAT17(in_stack_ffffffffffffe367,
                               CONCAT16(in_stack_ffffffffffffe366,in_stack_ffffffffffffe360)),
                      in_stack_ffffffffffffe358,(int *)CONCAT17(bVar3,in_stack_ffffffffffffe380));
      if (!(bool)in_stack_ffffffffffffe367) {
        local_4 = 0;
        local_ce8 = 1;
        goto LAB_001052fe;
      }
      in_stack_ffffffffffffe330 = local_17c8;
      in_stack_ffffffffffffe320 = &local_938;
      data_to_write = &local_938.gconsts_;
      in_stack_ffffffffffffe366 =
           sptk::GaussianMixtureModeling::CalculateLogProbability
                     (in_stack_ffffffffffffe500,in_stack_ffffffffffffe4fc,
                      (bool)in_stack_ffffffffffffe4fb,(bool)in_stack_ffffffffffffe4fa,
                      in_stack_ffffffffffffe4f0,
                      (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe4e8,
                      (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)in_stack_ffffffffffffe510,in_stack_ffffffffffffe518,
                      in_stack_ffffffffffffe520,in_stack_ffffffffffffe528,in_stack_ffffffffffffe530)
      ;
      if (!(bool)in_stack_ffffffffffffe366) {
        std::__cxx11::ostringstream::ostringstream(local_1940);
        std::operator<<((ostream *)local_1940,"Failed to compute log-probability");
        paVar6 = &local_1961;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1960,"gmmp",paVar6);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
        std::__cxx11::string::~string(local_1960);
        std::allocator<char>::~allocator((allocator<char> *)&local_1961);
        local_4 = 1;
        local_ce8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1940);
        goto LAB_001052fe;
      }
      bVar2 = sptk::WriteStream<double>((double)data_to_write,(ostream *)0x1051bb);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xffffffffffffe520);
    std::operator<<((ostream *)&stack0xffffffffffffe520,"Failed to write log-probability");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffe500,"gmmp",(allocator *)&stack0xffffffffffffe4ff);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffe500);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe4ff);
    local_4 = 1;
    local_ce8 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xffffffffffffe520);
LAB_001052fe:
    sptk::GaussianMixtureModeling::Buffer::~Buffer(in_stack_ffffffffffffe320);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe330);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_1598,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00104eca;
    std::__cxx11::ostringstream::ostringstream(local_1710);
    poVar4 = std::operator<<((ostream *)local_1710,"Cannot open file ");
    std::operator<<(poVar4,local_598);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1730,"gmmp",&local_1731);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508);
    std::__cxx11::string::~string(local_1730);
    std::allocator<char>::~allocator((allocator<char> *)&local_1731);
    local_4 = 1;
    local_ce8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1710);
  }
  std::ifstream::~ifstream(local_1598);
LAB_00105354:
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_ffffffffffffe330);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_ffffffffffffe330);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe330);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:k:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("gmmp", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("gmmp", error_message);
    return 1;
  }

  const bool is_diagonal(!full_covariance_flag);
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("gmmp", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, num_order + 1, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("gmmp", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(num_order + 1);
      if (is_diagonal) {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, num_order + 1, &variance,
                              &input_stream, NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      } else {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
      }
    }
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int length(num_order + 1);
  std::vector<double> input_vector(length);
  sptk::GaussianMixtureModeling::Buffer buffer;

  while (sptk::ReadStream(false, 0, 0, length, &input_vector, &input_stream,
                          NULL)) {
    double log_probability;
    if (!sptk::GaussianMixtureModeling::CalculateLogProbability(
            num_order, num_mixture, is_diagonal, true, input_vector, weights,
            mean_vectors, covariance_matrices, NULL, &log_probability,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to compute log-probability";
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
    if (!sptk::WriteStream(log_probability, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write log-probability";
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
  }

  return 0;
}